

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  int iVar1;
  void *pvVar2;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  int i_1;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_2;
  int i;
  int ret_1;
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffef6d8;
  int iStack_10920;
  int iStack_1091c;
  int iStack_10918;
  int iStack_10914;
  int iStack_10910;
  int iStack_1090c;
  int iStack_10904;
  undefined4 in_stack_fffffffffffef700;
  undefined4 in_stack_fffffffffffef704;
  EXRVersion *in_stack_fffffffffffef708;
  char **in_stack_fffffffffffef760;
  char *in_stack_fffffffffffef768;
  EXRHeader *in_stack_fffffffffffef770;
  EXRImage *in_stack_fffffffffffef778;
  EXRVersion *in_stack_fffffffffffef780;
  EXRHeader *in_stack_fffffffffffef788;
  long local_90;
  int local_88;
  long local_80;
  long local_78;
  EXRImage local_68;
  int local_38;
  int local_34;
  undefined8 *local_30;
  int *local_20;
  int *local_18;
  long *local_10;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.\n";
    }
    local_4 = -3;
  }
  else {
    local_30 = in_R8;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    InitEXRHeader((EXRHeader *)0x158bb1);
    InitEXRImage(&local_68);
    local_4 = ParseEXRVersionFromFile
                        (in_stack_fffffffffffef708,
                         (char *)CONCAT44(in_stack_fffffffffffef704,in_stack_fffffffffffef700));
    if (local_4 == 0) {
      if ((local_34 == 0) && (local_38 == 0)) {
        local_4 = ParseEXRHeaderFromFile
                            (in_stack_fffffffffffef788,in_stack_fffffffffffef780,
                             (char *)in_stack_fffffffffffef778,(char **)in_stack_fffffffffffef770);
        if (local_4 == 0) {
          for (iStack_10904 = 0; iStack_10904 < local_88; iStack_10904 = iStack_10904 + 1) {
            if (*(int *)(local_80 + (long)iStack_10904 * 4) == 1) {
              *(undefined4 *)(local_78 + (long)iStack_10904 * 4) = 2;
            }
          }
          local_4 = LoadEXRImageFromFile
                              (in_stack_fffffffffffef778,in_stack_fffffffffffef770,
                               in_stack_fffffffffffef768,in_stack_fffffffffffef760);
          if (local_4 == 0) {
            iStack_1090c = -1;
            iStack_10910 = -1;
            iStack_10914 = -1;
            iStack_10918 = -1;
            for (iStack_1091c = 0; iStack_1091c < local_88; iStack_1091c = iStack_1091c + 1) {
              iVar1 = strcmp((char *)(local_90 + (long)iStack_1091c * 0x110),"R");
              if (iVar1 == 0) {
                iStack_1090c = iStack_1091c;
              }
              else {
                iVar1 = strcmp((char *)(local_90 + (long)iStack_1091c * 0x110),"G");
                if (iVar1 == 0) {
                  iStack_10910 = iStack_1091c;
                }
                else {
                  iVar1 = strcmp((char *)(local_90 + (long)iStack_1091c * 0x110),"B");
                  if (iVar1 == 0) {
                    iStack_10914 = iStack_1091c;
                  }
                  else {
                    iVar1 = strcmp((char *)(local_90 + (long)iStack_1091c * 0x110),"A");
                    if (iVar1 == 0) {
                      iStack_10918 = iStack_1091c;
                    }
                  }
                }
              }
            }
            if (iStack_1090c == -1) {
              if (local_30 != (undefined8 *)0x0) {
                *local_30 = "R channel not found\n";
              }
              local_4 = -4;
            }
            else if (iStack_10910 == -1) {
              if (local_30 != (undefined8 *)0x0) {
                *local_30 = "G channel not found\n";
              }
              local_4 = -4;
            }
            else if (iStack_10914 == -1) {
              if (local_30 != (undefined8 *)0x0) {
                *local_30 = "B channel not found\n";
              }
              local_4 = -4;
            }
            else {
              pvVar2 = malloc((long)local_68.width * 0x10 * (long)local_68.height);
              *local_10 = (long)pvVar2;
              for (iStack_10920 = 0; iStack_10920 < local_68.width * local_68.height;
                  iStack_10920 = iStack_10920 + 1) {
                *(undefined4 *)(*local_10 + (long)(iStack_10920 << 2) * 4) =
                     *(undefined4 *)(local_68.images[iStack_1090c] + (long)iStack_10920 * 4);
                *(undefined4 *)(*local_10 + (long)(iStack_10920 * 4 + 1) * 4) =
                     *(undefined4 *)(local_68.images[iStack_10910] + (long)iStack_10920 * 4);
                *(undefined4 *)(*local_10 + (long)(iStack_10920 * 4 + 2) * 4) =
                     *(undefined4 *)(local_68.images[iStack_10914] + (long)iStack_10920 * 4);
                if (iStack_10918 == -1) {
                  *(undefined4 *)(*local_10 + (long)(iStack_10920 * 4 + 3) * 4) = 0x3f800000;
                }
                else {
                  *(undefined4 *)(*local_10 + (long)(iStack_10920 * 4 + 3) * 4) =
                       *(undefined4 *)(local_68.images[iStack_10918] + (long)iStack_10920 * 4);
                }
              }
              *local_18 = local_68.width;
              *local_20 = local_68.height;
              FreeEXRHeader(in_stack_fffffffffffef6d8);
              local_4 = 0;
            }
          }
        }
      }
      else {
        if (local_30 != (undefined8 *)0x0) {
          *local_30 = "Loading multipart or DeepImage is not supported yet.\n";
        }
        local_4 = -4;
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {
  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      if (err) {
        (*err) = "Loading multipart or DeepImage is not supported yet.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  (*out_rgba) = reinterpret_cast<float *>(
      malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
             static_cast<size_t>(exr_image.height)));
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exr_image.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exr_image.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA != -1) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);

  return TINYEXR_SUCCESS;
}